

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lrit.h
# Opt level: O2

AnnotationHeader * __thiscall
lrit::getHeader<lrit::AnnotationHeader>
          (AnnotationHeader *__return_storage_ptr__,lrit *this,Buffer *b,HeaderMap *m)

{
  const_iterator cVar1;
  runtime_error *this_00;
  int pos;
  int *in_R9;
  char local_44 [4];
  string local_40;
  
  pos = (int)m;
  cVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                  *)b,&AnnotationHeader::CODE);
  if (cVar1._M_node !=
      (_Base_ptr)
      &(b->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish) {
    getHeader<lrit::AnnotationHeader>
              (__return_storage_ptr__,this,(Buffer *)(ulong)*(uint *)&cVar1._M_node[1].field_0x4,pos
              );
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  local_44[0] = -0x5b;
  local_44[1] = '\0';
  local_44[2] = '\0';
  local_44[3] = '\0';
  util::str<char[37],char[86],char[2],int>
            (&local_40,(util *)"Assertion `it != m.end()` failed at ",
             (char (*) [37])
             "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/lrit/lrit.h"
             ,(char (*) [86])0x1c0c61,(char (*) [2])local_44,in_R9);
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

H getHeader(const Buffer& b, const HeaderMap& m) {
  auto it = m.find(H::CODE);
  ASSERT(it != m.end());
  return getHeader<H>(b, it->second);
}